

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

Error asmjit::v1_14::Formatter::formatFuncValuePack
                (String *sb,FormatFlags formatFlags,BaseCompiler *cc,FuncValuePack *pack,
                RegOnly *vRegs)

{
  Arch AVar1;
  Error EVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  Environment *environment;
  int iVar8;
  CallConv *cc_00;
  char cVar9;
  Error unaff_R14D;
  bool bVar10;
  
  iVar8 = 5;
  uVar4 = 3;
  do {
    if (uVar4 == 0xffffffffffffffff) {
      iVar8 = 0;
      break;
    }
    uVar6 = uVar4 & 0xffffffff;
    iVar8 = iVar8 + -1;
    uVar4 = uVar4 - 1;
  } while (pack->_values[uVar6]._data == 0);
  if (iVar8 == 0) {
    EVar2 = String::_opString(sb,kAppend,"void",0xffffffffffffffff);
    return EVar2;
  }
  if (iVar8 != 1) {
    String::_opChar(sb,kAppend,'[');
  }
  uVar4 = 0;
  do {
    if (pack->_values[uVar4]._data == 0) {
      cVar9 = '\x02';
      EVar2 = unaff_R14D;
LAB_0011f86e:
      bVar10 = false;
      unaff_R14D = EVar2;
    }
    else {
      if (uVar4 != 0) {
        cVar9 = '\x01';
        EVar2 = String::_opString(sb,kAppend,", ",0xffffffffffffffff);
        if (EVar2 != 0) goto LAB_0011f86e;
      }
      uVar3 = pack->_values[uVar4]._data;
      cc_00 = (CallConv *)sb;
      EVar2 = formatTypeId(sb,(TypeId)uVar3);
      if ((EVar2 == 0) &&
         (((uVar3 & 0x300) == 0 ||
          ((((cc_00 = (CallConv *)sb, EVar2 = String::_opChar(sb,kAppend,'@'), EVar2 == 0 &&
             (((uVar3 >> 10 & 1) == 0 ||
              (cc_00 = (CallConv *)sb, EVar2 = String::_opChar(sb,kAppend,'['), EVar2 == 0)))) &&
            (((uVar3 >> 8 & 1) == 0 ||
             (cc_00 = (CallConv *)sb,
             EVar2 = formatRegister(sb,formatFlags,(BaseEmitter *)cc,
                                    (cc->super_BaseBuilder).super_BaseEmitter._environment._arch,
                                    (RegType)(uVar3 >> 0x18),uVar3 >> 0x10 & 0xff), EVar2 == 0))))
           && ((((uVar3 >> 9 & 1) == 0 ||
                (cc_00 = (CallConv *)sb,
                EVar2 = String::_opFormat(sb,kAppend,"[%d]",(ulong)(uint)((int)uVar3 >> 0xc)),
                EVar2 == 0)) &&
               (((uVar3 >> 10 & 1) == 0 ||
                (cc_00 = (CallConv *)sb, EVar2 = String::_opChar(sb,kAppend,']'), EVar2 == 0))))))))
         )) {
        EVar2 = 0;
      }
      bVar10 = EVar2 == 0;
      cVar9 = !bVar10;
      if (!bVar10) {
        unaff_R14D = EVar2;
      }
      if (vRegs != (RegOnly *)0x0 && !(bool)cVar9) {
        if (vRegs[uVar4]._signature._bits == 0) {
          lVar5 = 0;
        }
        else {
          uVar3 = vRegs[uVar4]._id - 0x100;
          if (uVar3 < *(uint *)&cc->field_0x1f0) {
            if (*(uint *)&cc->field_0x1f0 <= uVar3) {
              formatFuncValuePack();
              *(undefined1 (*) [16])((long)(cc_00->_passedOrder)._data + 0xc) =
                   (undefined1  [16])0x0;
              *(undefined1 (*) [16])((cc_00->_preservedRegs)._data + 3) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])((long)(cc_00->_passedOrder)._data + 0x1c) =
                   (undefined1  [16])0x0;
              *(undefined1 (*) [16])((long)(cc_00->_passedOrder)._data + 0x2c) =
                   (undefined1  [16])0x0;
              *(undefined1 (*) [16])((cc_00->_passedRegs)._data + 3) = (undefined1  [16])0x0;
              cc_00->_saveRestoreAlignment = (uchar  [4])0x0;
              (cc_00->_passedRegs)._data[0] = 0;
              (cc_00->_passedRegs)._data[1] = 0;
              (cc_00->_passedRegs)._data[2] = 0;
              cc_00->_arch = kUnknown;
              cc_00->_id = kCDecl;
              cc_00->_strategy = kDefault;
              cc_00->_redZoneSize = '\0';
              cc_00->_spillZoneSize = '\0';
              cc_00->_naturalStackAlignment = '\0';
              cc_00->_reserved[0] = '\0';
              cc_00->_reserved[1] = '\0';
              cc_00->_flags = kNone;
              cc_00->_saveRestoreRegSize = (uchar  [4])0x0;
              *(undefined4 *)((long)(cc_00->_passedOrder)._data + 0x3c) = 0;
              (cc_00->_passedOrder)._data[0].packed[0] = 0xffffffff;
              (cc_00->_passedOrder)._data[0].packed[1] = 0xffffffff;
              (cc_00->_passedOrder)._data[0].packed[2] = 0xffffffff;
              (cc_00->_passedOrder)._data[0].packed[3] = 0xffffffff;
              (cc_00->_passedOrder)._data[1].packed[0] = 0xffffffff;
              *(undefined4 *)((long)(cc_00->_passedOrder)._data + 0x14) = 0xffffffff;
              *(undefined4 *)((long)(cc_00->_passedOrder)._data + 0x18) = 0xffffffff;
              *(undefined4 *)((long)(cc_00->_passedOrder)._data + 0x1c) = 0xffffffff;
              (cc_00->_passedOrder)._data[2].packed[0] = 0xffffffff;
              *(undefined4 *)((long)(cc_00->_passedOrder)._data + 0x24) = 0xffffffff;
              *(undefined4 *)((long)(cc_00->_passedOrder)._data + 0x28) = 0xffffffff;
              *(undefined4 *)((long)(cc_00->_passedOrder)._data + 0x2c) = 0xffffffff;
              (cc_00->_passedOrder)._data[3].packed[0] = 0xffffffff;
              *(undefined4 *)((long)(cc_00->_passedOrder)._data + 0x34) = 0xffffffff;
              *(undefined4 *)((long)(cc_00->_passedOrder)._data + 0x38) = 0xffffffff;
              *(undefined4 *)((long)(cc_00->_passedOrder)._data + 0x3c) = 0xffffffff;
              AVar1 = environment->_arch;
              if ((byte)(AVar1 - k32BitMask) < 2) {
                EVar2 = x86::FuncInternal::initCallConv(cc_00,(CallConvId)vRegs,environment);
                return EVar2;
              }
              if ((AVar1 != kAArch64_BE) && (AVar1 != kAArch64)) {
                return 2;
              }
              EVar2 = a64::FuncInternal::initCallConv(cc_00,(CallConvId)vRegs,environment);
              return EVar2;
            }
            lVar5 = *(long *)(*(long *)&cc->_vRegArray + (ulong)uVar3 * 8);
          }
          else {
            lVar5 = 0;
          }
        }
        pcVar7 = "<none>";
        if (lVar5 != 0) {
          if (*(uint *)(lVar5 + 0x18) < 0xc) {
            pcVar7 = (char *)(lVar5 + 0x1c);
          }
          else {
            pcVar7 = *(char **)(lVar5 + 0x20);
          }
        }
        EVar2 = String::_opFormat(sb,kAppend," %s",pcVar7);
        bVar10 = EVar2 == 0;
        cVar9 = !bVar10;
        if (!bVar10) {
          unaff_R14D = EVar2;
        }
      }
    }
    if (!bVar10) goto LAB_0011f919;
    uVar4 = uVar4 + 1;
  } while (iVar8 + (uint)(iVar8 == 0) != uVar4);
  cVar9 = '\x02';
LAB_0011f919:
  EVar2 = 0;
  if (cVar9 != '\x02') {
    EVar2 = unaff_R14D;
  }
  if ((iVar8 != 1) && (cVar9 == '\x02')) {
    String::_opChar(sb,kAppend,']');
    EVar2 = 0;
  }
  return EVar2;
}

Assistant:

static Error formatFuncValuePack(
  String& sb,
  FormatFlags formatFlags,
  const BaseCompiler* cc,
  const FuncValuePack& pack,
  const RegOnly* vRegs) noexcept {

  size_t count = pack.count();
  if (!count)
    return sb.append("void");

  if (count > 1)
    sb.append('[');

  for (uint32_t valueIndex = 0; valueIndex < count; valueIndex++) {
    const FuncValue& value = pack[valueIndex];
    if (!value)
      break;

    if (valueIndex)
      ASMJIT_PROPAGATE(sb.append(", "));

    ASMJIT_PROPAGATE(formatFuncValue(sb, formatFlags, cc, value));

    if (vRegs) {
      const VirtReg* virtReg = nullptr;
      static const char nullReg[] = "<none>";

      if (vRegs[valueIndex].isReg() && cc->isVirtIdValid(vRegs[valueIndex].id()))
        virtReg = cc->virtRegById(vRegs[valueIndex].id());

      ASMJIT_PROPAGATE(sb.appendFormat(" %s", virtReg ? virtReg->name() : nullReg));
    }
  }

  if (count > 1)
    sb.append(']');

  return kErrorOk;
}